

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pPVar3;
  undefined *puVar4;
  int iVar5;
  long lVar6;
  pointer pPVar7;
  ScopedElement scoped;
  ScopedElement e;
  string local_a8;
  ScopedElement local_88;
  ScopedElement local_80;
  string local_78;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  double local_38;
  
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  local_38 = suiteTime;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"testsuite","");
  this_00 = &this->xml;
  local_80.m_writer = this_00;
  XmlWriter::startElement(this_00,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"name","");
  XmlWriter::writeAttribute(this_00,&local_a8,&(groupNode->value).groupInfo.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"errors","");
  XmlWriter::writeAttribute<unsigned_int>(this_00,&local_a8,&this->unexpectedExceptions);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"failures","");
  local_78._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed - (ulong)this->unexpectedExceptions);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_a8,(unsigned_long *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tests","");
  local_78._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed +
                (groupNode->value).totals.assertions.passed);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_a8,(unsigned_long *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"hostname","");
  XmlWriter::writeAttribute<char[4]>(this_00,&local_a8,(char (*) [4])"tbd");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  iVar5 = (*(((this->super_CumulativeReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xb])();
  if (iVar5 == 2) {
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"time","");
    XmlWriter::writeAttribute<char[1]>(this_00,&local_a8,(char (*) [1])0x1449cd);
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"time","");
    XmlWriter::writeAttribute<double>(this_00,&local_a8,&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"timestamp","");
  XmlWriter::writeAttribute<char[4]>(this_00,&local_a8,(char (*) [4])"tbd");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  pPVar3 = (groupNode->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar7 = (groupNode->children).
                super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar7 != pPVar3; pPVar7 = pPVar7 + 1) {
    writeTestCase(this,pPVar7->m_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"system-out","");
  local_88.m_writer = this_00;
  XmlWriter::startElement(this_00,&local_a8);
  std::__cxx11::stringbuf::str();
  puVar4 = trim(std::__cxx11::string_const&)::whitespaceChars;
  strlen(trim(std::__cxx11::string_const&)::whitespaceChars);
  lVar6 = std::__cxx11::string::find_first_not_of((char *)local_58,(ulong)puVar4,0);
  puVar4 = trim(std::__cxx11::string_const&)::whitespaceChars;
  strlen(trim(std::__cxx11::string_const&)::whitespaceChars);
  std::__cxx11::string::find_last_not_of((char *)local_58,(ulong)puVar4,0xffffffffffffffff);
  if (lVar6 == -1) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)&local_78,(ulong)local_58);
  }
  XmlWriter::writeText(local_88.m_writer,&local_78,false);
  paVar2 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"system-err","");
  local_88.m_writer = this_00;
  XmlWriter::startElement(this_00,&local_a8);
  std::__cxx11::stringbuf::str();
  puVar4 = trim(std::__cxx11::string_const&)::whitespaceChars;
  strlen(trim(std::__cxx11::string_const&)::whitespaceChars);
  lVar6 = std::__cxx11::string::find_first_not_of((char *)local_58,(ulong)puVar4,0);
  puVar4 = trim(std::__cxx11::string_const&)::whitespaceChars;
  strlen(trim(std::__cxx11::string_const&)::whitespaceChars);
  std::__cxx11::string::find_last_not_of((char *)local_58,(ulong)puVar4,0xffffffffffffffff);
  if (lVar6 == -1) {
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_78,(ulong)local_58);
  }
  XmlWriter::writeText(local_88.m_writer,&local_78,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_80);
  return;
}

Assistant:

void writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );
            TestGroupStats const& stats = groupNode.value;
            xml.writeAttribute( "name", stats.groupInfo.name );
            xml.writeAttribute( "errors", unexpectedExceptions );
            xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
            xml.writeAttribute( "tests", stats.totals.assertions.total() );
            xml.writeAttribute( "hostname", "tbd" ); // !TBD
            if( m_config->showDurations() == ShowDurations::Never )
                xml.writeAttribute( "time", "" );
            else
                xml.writeAttribute( "time", suiteTime );
            xml.writeAttribute( "timestamp", "tbd" ); // !TBD

            // Write test cases
            for( TestGroupNode::ChildNodes::const_iterator
                    it = groupNode.children.begin(), itEnd = groupNode.children.end();
                    it != itEnd;
                    ++it )
                writeTestCase( **it );

            xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite.str() ), false );
            xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite.str() ), false );
        }